

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

bool GGUFMeta::GKV<unsigned_short>::validate_override
               (llama_model_kv_override_type expected_type,llama_model_kv_override *ovrd)

{
  char *pcVar1;
  char *pcVar2;
  runtime_error *this;
  bool bVar3;
  string sStack_48;
  
  if (ovrd == (llama_model_kv_override *)0x0) {
    bVar3 = false;
  }
  else if (ovrd->tag == expected_type) {
    pcVar1 = override_type_to_str(expected_type);
    llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: Using metadata override (%5s) \'%s\' = ",
                       "validate_override",pcVar1,ovrd->key);
    switch(ovrd->tag) {
    case LLAMA_KV_OVERRIDE_TYPE_INT:
      pcVar1 = (char *)(ovrd->field_2).val_i64;
      pcVar2 = "%ld\n";
      break;
    case LLAMA_KV_OVERRIDE_TYPE_FLOAT:
      llama_log_internal(GGML_LOG_LEVEL_INFO,"%.6f\n",(ovrd->field_2).val_i64);
      return true;
    case LLAMA_KV_OVERRIDE_TYPE_BOOL:
      pcVar1 = "false";
      if ((ovrd->field_2).val_bool != false) {
        pcVar1 = "true";
      }
      pcVar2 = "%s\n";
      break;
    case LLAMA_KV_OVERRIDE_TYPE_STR:
      pcVar1 = (char *)&ovrd->field_2;
      pcVar2 = "%s\n";
      break;
    default:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      pcVar1 = override_type_to_str(ovrd->tag);
      format_abi_cxx11_(&sStack_48,"Unsupported attempt to override %s type for metadata key %s\n",
                        pcVar1,ovrd->key);
      std::runtime_error::runtime_error(this,(string *)&sStack_48);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    llama_log_internal(GGML_LOG_LEVEL_INFO,pcVar2,pcVar1);
    bVar3 = true;
  }
  else {
    pcVar1 = override_type_to_str(expected_type);
    pcVar2 = override_type_to_str(ovrd->tag);
    bVar3 = false;
    llama_log_internal(GGML_LOG_LEVEL_WARN,
                       "%s: Warning: Bad metadata override type for key \'%s\', expected %s but got %s\n"
                       ,"validate_override",ovrd->key,pcVar1,pcVar2);
  }
  return bVar3;
}

Assistant:

static bool validate_override(const llama_model_kv_override_type expected_type, const struct llama_model_kv_override * ovrd) {
            if (!ovrd) { return false; }
            if (ovrd->tag == expected_type) {
                LLAMA_LOG_INFO("%s: Using metadata override (%5s) '%s' = ",
                    __func__, override_type_to_str(ovrd->tag), ovrd->key);
                switch (ovrd->tag) {
                    case LLAMA_KV_OVERRIDE_TYPE_BOOL:  {
                        LLAMA_LOG_INFO("%s\n", ovrd->val_bool ? "true" : "false");
                    } break;
                    case LLAMA_KV_OVERRIDE_TYPE_INT:   {
                        LLAMA_LOG_INFO("%" PRId64 "\n", ovrd->val_i64);
                    } break;
                    case LLAMA_KV_OVERRIDE_TYPE_FLOAT: {
                        LLAMA_LOG_INFO("%.6f\n", ovrd->val_f64);
                    } break;
                    case LLAMA_KV_OVERRIDE_TYPE_STR: {
                        LLAMA_LOG_INFO("%s\n", ovrd->val_str);
                    } break;
                    default:
                        // Shouldn't be possible to end up here, but just in case...
                        throw std::runtime_error(
                            format("Unsupported attempt to override %s type for metadata key %s\n",
                                override_type_to_str(ovrd->tag), ovrd->key));
                }
                return true;
            }
            LLAMA_LOG_WARN("%s: Warning: Bad metadata override type for key '%s', expected %s but got %s\n",
                __func__, ovrd->key, override_type_to_str(expected_type), override_type_to_str(ovrd->tag));
            return false;
        }